

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

void Gia_ManFromBridgeCex(FILE *pFile,Abc_Cex_t *pCex)

{
  size_t sVar1;
  uint uVar2;
  uchar *pBuffer;
  bool bVar3;
  int iVar4;
  Vec_Str_t *vStr;
  char *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  pcVar5 = (char *)malloc(1000);
  vStr->pArray = pcVar5;
  *pcVar5 = '\x02';
  vStr->nSize = 2;
  pcVar5[1] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iPo);
  uVar8 = vStr->nSize;
  if (uVar8 == vStr->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar8 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar1);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar1);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar1;
    }
  }
  else {
    pcVar5 = vStr->pArray;
  }
  vStr->nSize = uVar8 + 1;
  pcVar5[(int)uVar8] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iFrame);
  uVar8 = vStr->nSize;
  if (uVar8 == vStr->nCap) {
    if ((int)uVar8 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar8 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar1);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar1);
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar1;
    }
  }
  else {
    pcVar5 = vStr->pArray;
  }
  vStr->nSize = uVar8 + 1;
  pcVar5[(int)uVar8] = '\x01';
  Gia_AigerWriteUnsigned(vStr,pCex->iFrame + 1);
  iVar4 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    uVar8 = pCex->nPis;
    iVar6 = 0;
    do {
      Gia_AigerWriteUnsigned(vStr,uVar8);
      uVar8 = pCex->nPis;
      if (0 < (int)uVar8) {
        iVar7 = 0;
        do {
          uVar8 = (&pCex[1].iPo)[iVar4 + iVar7 >> 5];
          uVar2 = vStr->nSize;
          if (uVar2 == vStr->nCap) {
            if ((int)uVar2 < 0x10) {
              if (vStr->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vStr->pArray,0x10);
              }
              vStr->pArray = pcVar5;
              vStr->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar2 * 2;
              if (vStr->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar1);
              }
              else {
                pcVar5 = (char *)realloc(vStr->pArray,sVar1);
              }
              vStr->pArray = pcVar5;
              vStr->nCap = (int)sVar1;
            }
          }
          else {
            pcVar5 = vStr->pArray;
          }
          vStr->nSize = uVar2 + 1;
          pcVar5[(int)uVar2] = (uVar8 >> (iVar4 + iVar7 & 0x1fU) & 1) == 0 ^ 3;
          iVar7 = iVar7 + 1;
          uVar8 = pCex->nPis;
        } while (iVar7 < (int)uVar8);
        iVar4 = iVar4 + iVar7;
      }
      bVar3 = iVar6 < pCex->iFrame;
      iVar6 = iVar6 + 1;
    } while (bVar3);
  }
  if (iVar4 == pCex->nBits) {
    uVar8 = vStr->nSize;
    if (uVar8 == vStr->nCap) {
      if ((int)uVar8 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)uVar8 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar1);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,sVar1);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar1;
      }
    }
    else {
      pcVar5 = vStr->pArray;
    }
    vStr->nSize = uVar8 + 1;
    pcVar5[(int)uVar8] = '\x01';
    Gia_AigerWriteUnsigned(vStr,pCex->nRegs);
    if (0 < pCex->nRegs) {
      iVar4 = 0;
      do {
        uVar8 = vStr->nSize;
        if (uVar8 == vStr->nCap) {
          if ((int)uVar8 < 0x10) {
            if (vStr->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(vStr->pArray,0x10);
            }
            vStr->pArray = pcVar5;
            vStr->nCap = 0x10;
          }
          else {
            sVar1 = (ulong)uVar8 * 2;
            if (vStr->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar1);
            }
            else {
              pcVar5 = (char *)realloc(vStr->pArray,sVar1);
            }
            vStr->pArray = pcVar5;
            vStr->nCap = (int)sVar1;
          }
        }
        else {
          pcVar5 = vStr->pArray;
        }
        vStr->nSize = uVar8 + 1;
        pcVar5[(int)uVar8] = '\x02';
        iVar4 = iVar4 + 1;
      } while (iVar4 < pCex->nRegs);
    }
    pBuffer = (uchar *)vStr->pArray;
    Gia_CreateHeader(pFile,0x65,vStr->nSize,pBuffer);
    if (pBuffer != (uchar *)0x0) {
      free(pBuffer);
    }
    free(vStr);
    fflush((FILE *)pFile);
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                ,0x114,"void Gia_ManFromBridgeCex(FILE *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManFromBridgeCex( FILE * pFile, Abc_Cex_t * pCex )
{
    int i, f, iBit;//, RetValue;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // false
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iPo ); // number of the property (Armin's encoding)
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame ); // depth

    Gia_AigerWriteUnsigned( vStr, 1 ); // concrete
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame + 1 ); // number of frames (1 more than depth)
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_AigerWriteUnsigned( vStr, pCex->nPis ); // num of inputs
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            Vec_StrPush( vStr, (char)(Abc_InfoHasBit(pCex->pData, iBit) ? BRIDGE_VALUE_1:BRIDGE_VALUE_0) ); // value
    }
    assert( iBit == pCex->nBits );
    Vec_StrPush( vStr, (char)1 ); // the number of frames (for a concrete counter-example)
    Gia_AigerWriteUnsigned( vStr, pCex->nRegs ); // num of flops
    for ( i = 0; i < pCex->nRegs; i++ )
        Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // always zero!!!
//    RetValue = fwrite( Vec_StrArray(vStr), Vec_StrSize(vStr), 1, pFile );
    Gia_CreateHeader(pFile, 101/*type=Result*/, Vec_StrSize(vStr), (unsigned char*)Vec_StrArray(vStr));

    Vec_StrFree( vStr );
    fflush(pFile);
}